

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int32_t intersect_uint16(uint16_t *A,size_t lenA,uint16_t *B,size_t lenB,uint16_t *out)

{
  ushort *puVar1;
  ushort *puVar2;
  ushort uVar3;
  uint16_t *puVar4;
  ushort uVar5;
  
  if (lenB == 0 || lenA == 0) {
    return 0;
  }
  puVar1 = A + lenA;
  puVar2 = B + lenB;
  puVar4 = out;
LAB_001036b6:
  uVar5 = *B;
  do {
    uVar3 = *A;
    if (uVar5 <= uVar3) {
      while( true ) {
        uVar5 = *B;
        if (uVar3 <= uVar5) break;
        B = B + 1;
        if (B == puVar2) goto LAB_00103700;
      }
      if (uVar3 == uVar5) break;
    }
    A = A + 1;
    if (A == puVar1) goto LAB_00103700;
  } while( true );
  *puVar4 = uVar3;
  puVar4 = puVar4 + 1;
  A = A + 1;
  if ((A == puVar1) || (B = B + 1, B == puVar2)) {
LAB_00103700:
    return (int32_t)((ulong)((long)puVar4 - (long)out) >> 1);
  }
  goto LAB_001036b6;
}

Assistant:

int32_t intersect_uint16(const uint16_t *A, const size_t lenA,
                         const uint16_t *B, const size_t lenB, uint16_t *out) {
    const uint16_t *initout = out;
    if (lenA == 0 || lenB == 0) return 0;
    const uint16_t *endA = A + lenA;
    const uint16_t *endB = B + lenB;

    while (1) {
        while (*A < *B) {
        SKIP_FIRST_COMPARE:
            if (++A == endA) return (int32_t)(out - initout);
        }
        while (*A > *B) {
            if (++B == endB) return (int32_t)(out - initout);
        }
        if (*A == *B) {
            *out++ = *A;
            if (++A == endA || ++B == endB) return (int32_t)(out - initout);
        } else {
            goto SKIP_FIRST_COMPARE;
        }
    }
    // return (int32_t)(out - initout);  // NOTREACHED
}